

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O1

void __thiscall fineftp::FtpSession::sendRawFtpMessage(FtpSession *this,string *raw_message)

{
  pointer pcVar1;
  strand_service *psVar2;
  implementation_type psVar3;
  scheduler_operation *psVar4;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  *pcVar5;
  scheduler_operation *psVar6;
  template_rebind_alloc<completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_basic_executor_type<allocator<void>,_0U>_>_>
  a;
  undefined8 uVar7;
  long *in_FS_OFFSET;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  ptr local_38;
  
  ::std::__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fineftp::FtpSession,void>
            ((__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2> *)local_68,
             (__weak_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2> *)this);
  pcVar1 = (raw_message->_M_dataplus)._M_p;
  local_58 = &local_48;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + raw_message->_M_string_length);
  psVar2 = (this->command_write_strand_).service_;
  if (*(long *)(*in_FS_OFFSET + -0x10) == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x10) + 8);
  }
  local_38.h = (anon_class_48_2_3c81cf3a_for_handler_ *)local_68;
  pcVar5 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
            *)asio::detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                        (uVar7,0x50);
  uVar7 = local_68._8_8_;
  local_38.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)0x0;
  (pcVar5->super_operation).next_ = (scheduler_operation *)0x0;
  (pcVar5->super_operation).func_ =
       asio::detail::
       completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
       ::do_complete;
  (pcVar5->super_operation).task_result_ = 0;
  (pcVar5->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68._0_8_;
  (pcVar5->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pcVar5->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  local_68._0_8_ = 0;
  (pcVar5->handler_).raw_message._M_dataplus._M_p = (pointer)&(pcVar5->handler_).raw_message.field_2
  ;
  local_38.v = pcVar5;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(pcVar5->handler_).raw_message,local_58,local_58->_M_local_buf + local_50);
  local_38.p = pcVar5;
  pthread_mutex_lock((pthread_mutex_t *)&((this->command_write_strand_).impl_)->mutex_);
  psVar3 = (this->command_write_strand_).impl_;
  if (psVar3->locked_ == true) {
    (pcVar5->super_operation).next_ = (scheduler_operation *)0x0;
    psVar4 = (psVar3->waiting_queue_).back_;
    psVar6 = (scheduler_operation *)&(psVar3->waiting_queue_).back_;
    if (psVar4 != (scheduler_operation *)0x0) {
      psVar6 = psVar4;
    }
    psVar6->next_ = (scheduler_operation *)pcVar5;
    (&(psVar3->waiting_queue_).front_)[psVar4 != (scheduler_operation *)0x0] =
         (scheduler_operation *)pcVar5;
    pthread_mutex_unlock((pthread_mutex_t *)&((this->command_write_strand_).impl_)->mutex_);
  }
  else {
    psVar3->locked_ = true;
    pthread_mutex_unlock((pthread_mutex_t *)&psVar3->mutex_);
    psVar3 = (this->command_write_strand_).impl_;
    (pcVar5->super_operation).next_ = (scheduler_operation *)0x0;
    psVar4 = (psVar3->ready_queue_).back_;
    psVar6 = (scheduler_operation *)&(psVar3->ready_queue_).back_;
    if (psVar4 != (scheduler_operation *)0x0) {
      psVar6 = psVar4;
    }
    psVar6->next_ = (scheduler_operation *)pcVar5;
    (&(psVar3->ready_queue_).front_)[psVar4 != (scheduler_operation *)0x0] =
         (scheduler_operation *)pcVar5;
    asio::detail::scheduler::post_immediate_completion
              (psVar2->io_context_impl_,&((this->command_write_strand_).impl_)->super_operation,
               false);
  }
  local_38.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)0x0;
  local_38.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)0x0;
  asio::detail::
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  ::ptr::reset(&local_38);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  return;
}

Assistant:

void FtpSession::sendRawFtpMessage(const std::string& raw_message)
  {
    command_write_strand_.post([me = shared_from_this(), raw_message]()
                                {
                                  bool write_in_progress = !me->command_output_queue_.empty();
                                  me->command_output_queue_.push_back(raw_message);
                                  if (!write_in_progress)
                                  {
                                    me->startSendingMessages();
                                  }
                                });
  }